

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

bool __thiscall OpenGliderConnection::APRSProcessData(OpenGliderConnection *this,char *buffer)

{
  bool bVar1;
  ulong uVar2;
  char *in_RSI;
  long *in_RDI;
  float fVar3;
  size_t lnEnd;
  bool in_stack_0000017f;
  long in_stack_00000180;
  char *in_stack_00000188;
  LTOnlineChannel *in_stack_00000190;
  string *in_stack_000007f0;
  OpenGliderConnection *in_stack_000007f8;
  DataRefs *in_stack_ffffffffffffff88;
  string local_40 [32];
  long local_20;
  char *local_18;
  
  local_18 = in_RSI;
  LTOnlineChannel::DebugLogRaw
            (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_0000017f);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x53),local_18);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    fVar3 = DataRefs::GetMiscNetwTime(in_stack_ffffffffffffff88);
    *(float *)(in_RDI + 0x57) = fVar3;
    (**(code **)(*in_RDI + 0x48))();
    local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x53),0x38308a);
    while (local_20 != -1) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)(in_RDI + 0x53));
      bVar1 = APRSProcessLine(in_stack_000007f8,in_stack_000007f0);
      std::__cxx11::string::~string(local_40);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      std::__cxx11::string::erase((ulong)(in_RDI + 0x53),0);
      local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x53),0x38308a);
    }
  }
  return true;
}

Assistant:

bool OpenGliderConnection::APRSProcessData (const char* buffer)
{
    // save the data to our processing buffer
    DebugLogRaw(buffer, HTTP_FLAG_UDP);
    aprsData += buffer;
    if (aprsData.empty())            // weird...but not an error if there's nothing to process
        return true;
    
    // So we just received something
    aprsLastData = dataRefs.GetMiscNetwTime();
    DecErrCnt();

    // process the input line by line, expected a line to be ended by \r\n
    // (If CR/LF is yet missing then the received data is yet incomplete and will be completed with the next received data)
    for (size_t lnEnd = aprsData.find("\r\n");
         lnEnd != std::string::npos;
         aprsData.erase(0,lnEnd+2), lnEnd = aprsData.find("\r\n"))
    {
        if (!APRSProcessLine(aprsData.substr(0,lnEnd)))
            return false;
    }
    return true;
}